

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O1

int lj_cf_ffi_errno(lua_State *L)

{
  int iVar1;
  TValue *pTVar2;
  int32_t iVar3;
  int *piVar4;
  
  piVar4 = __errno_location();
  iVar1 = *piVar4;
  if (L->base < L->top) {
    iVar3 = ffi_checkint(L,1);
    *piVar4 = iVar3;
  }
  pTVar2 = L->top;
  L->top = pTVar2 + 1;
  pTVar2->n = (double)iVar1;
  return 1;
}

Assistant:

LJLIB_CF(ffi_errno)	LJLIB_REC(.)
{
  int err = errno;
  if (L->top > L->base)
    errno = ffi_checkint(L, 1);
  setintV(L->top++, err);
  return 1;
}